

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O0

void __thiscall
persistent_cohomology_single_field_coeff_limit::test_method
          (persistent_cohomology_single_field_coeff_limit *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  invalid_argument *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]> local_a0;
  assertion_result local_80;
  basic_cstring<const_char> local_68;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48 [2];
  basic_cstring<const_char> local_28;
  persistent_cohomology_single_field_coeff_limit *local_18;
  persistent_cohomology_single_field_coeff_limit *this_local;
  
  local_18 = this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0xa3,local_48);
    test_persistence_with_coeff_field(0xb50d);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_68);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0xa3,&local_68);
      boost::test_tools::assertion_result::assertion_result(&local_80,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_a0,prev,
                 (char (*) [56])"exception std::invalid_argument expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
                 ,0x88);
      boost::test_tools::tt_detail::report_assertion(&local_80,&local_a0,&ex,0xa3,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>::
      ~lazy_ostream_impl(&local_a0);
      boost::test_tools::assertion_result::~assertion_result(&local_80);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( persistent_cohomology_single_field_coeff_limit )
{
  BOOST_CHECK_THROW(test_persistence_with_coeff_field(46349), std::invalid_argument);
}